

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__writefv(stbi__write_context *s,char *fmt,__va_list_tag *v)

{
  uint uVar1;
  __va_list_tag *p_Var2;
  undefined4 *local_88;
  undefined4 *local_70;
  undefined4 *local_58;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  undefined4 local_30;
  uchar b_1 [4];
  stbiw_uint32 x_2;
  uchar b [2];
  int x_1;
  uchar x;
  __va_list_tag *v_local;
  char *fmt_local;
  stbi__write_context *s_local;
  
  v_local = (__va_list_tag *)fmt;
  while ((char)v_local->gp_offset != '\0') {
    p_Var2 = (__va_list_tag *)((long)&v_local->gp_offset + 1);
    switch((char)v_local->gp_offset) {
    case ' ':
      v_local = p_Var2;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_image_write.h"
                    ,0x173,
                    "void stbiw__writefv(stbi__write_context *, const char *, __va_list_tag *)");
    case '1':
      uVar1 = v->gp_offset;
      if (uVar1 < 0x29) {
        local_58 = (undefined4 *)((long)(int)uVar1 + (long)v->reg_save_area);
        v->gp_offset = uVar1 + 8;
      }
      else {
        local_58 = (undefined4 *)v->overflow_arg_area;
        v->overflow_arg_area = local_58 + 2;
      }
      b[1] = (uchar)*local_58;
      (*s->func)(s->context,b + 1,1);
      v_local = p_Var2;
      break;
    case '2':
      uVar1 = v->gp_offset;
      if (uVar1 < 0x29) {
        local_70 = (undefined4 *)((long)(int)uVar1 + (long)v->reg_save_area);
        v->gp_offset = uVar1 + 8;
      }
      else {
        local_70 = (undefined4 *)v->overflow_arg_area;
        v->overflow_arg_area = local_70 + 2;
      }
      b_1[2] = (uchar)*local_70;
      b_1[3] = (uchar)((uint)*local_70 >> 8);
      (*s->func)(s->context,b_1 + 2,2);
      v_local = p_Var2;
      break;
    case '4':
      uVar1 = v->gp_offset;
      if (uVar1 < 0x29) {
        local_88 = (undefined4 *)((long)(int)uVar1 + (long)v->reg_save_area);
        v->gp_offset = uVar1 + 8;
      }
      else {
        local_88 = (undefined4 *)v->overflow_arg_area;
        v->overflow_arg_area = local_88 + 2;
      }
      local_30 = *local_88;
      local_34 = (undefined1)local_30;
      local_33 = (undefined1)((uint)local_30 >> 8);
      local_32 = (undefined1)((uint)local_30 >> 0x10);
      local_31 = (undefined1)((uint)local_30 >> 0x18);
      (*s->func)(s->context,&local_34,4);
      v_local = p_Var2;
    }
  }
  return;
}

Assistant:

static void stbiw__writefv(stbi__write_context *s, const char *fmt, va_list v)
{
   while (*fmt) {
      switch (*fmt++) {
         case ' ': break;
         case '1': { unsigned char x = STBIW_UCHAR(va_arg(v, int));
                     s->func(s->context,&x,1);
                     break; }
         case '2': { int x = va_arg(v,int);
                     unsigned char b[2];
                     b[0] = STBIW_UCHAR(x);
                     b[1] = STBIW_UCHAR(x>>8);
                     s->func(s->context,b,2);
                     break; }
         case '4': { stbiw_uint32 x = va_arg(v,int);
                     unsigned char b[4];
                     b[0]=STBIW_UCHAR(x);
                     b[1]=STBIW_UCHAR(x>>8);
                     b[2]=STBIW_UCHAR(x>>16);
                     b[3]=STBIW_UCHAR(x>>24);
                     s->func(s->context,b,4);
                     break; }
         default:
            STBIW_ASSERT(0);
            return;
      }
   }
}